

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoardIO.cpp
# Opt level: O0

bool __thiscall BoardIO::WriteIPv4Address(BoardIO *this,uint32_t IPaddr)

{
  uint32_t uVar1;
  int iVar2;
  ostream *this_00;
  byte local_29;
  uint32_t IPaddr_local;
  BoardIO *this_local;
  
  uVar1 = GetFirmwareVersion(this);
  if (uVar1 < 7) {
    this_00 = std::operator<<((ostream *)&std::cerr,
                              "BoardIO::WriteIPv4Address: requires firmware 7 or above");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    if (this->port == (BasePort *)0x0) {
      local_29 = 0;
    }
    else {
      iVar2 = (*this->port->_vptr_BasePort[0x24])(this->port,(ulong)this->BoardId,0xb,(ulong)IPaddr)
      ;
      local_29 = (byte)iVar2;
    }
    this_local._7_1_ = (bool)(local_29 & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool BoardIO::WriteIPv4Address(uint32_t IPaddr)
{
    if (GetFirmwareVersion() < 7) {
        std::cerr << "BoardIO::WriteIPv4Address: requires firmware 7 or above" << std::endl;
        return false;
    }
    return (port ? port->WriteQuadlet(BoardId, BoardIO::IP_ADDR, IPaddr) : false);
}